

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O3

void disas_t32_extract_s_rxi_rot(DisasContext_conflict1 *ctx,arg_s_rri_rot *a,uint32_t insn)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  *(uint *)&(ctx->base).pc_next = (uint)((ulong)a >> 0x14) & 1;
  *(uint *)((long)&(ctx->base).tb + 4) = (uint)((ulong)a >> 8) & 0xf;
  uVar1 = (uint)a & 0xff;
  uVar3 = (uint)a >> 0xf & 0x800 | (uint)((ulong)a >> 4) & 0x700;
  uVar2 = uVar1;
  switch(uVar3 >> 8) {
  case 0:
    break;
  case 1:
    uVar2 = uVar1 << 0x10 | uVar1;
    break;
  case 2:
    uVar2 = uVar1 * 0x1000100;
    break;
  case 3:
    uVar2 = uVar1 * 0x1010101;
    break;
  default:
    uVar2 = uVar1 | 0x80;
  }
  *(uint *)&(ctx->base).tb = uVar2;
  uVar2 = (uVar1 | uVar3) >> 7;
  if (uVar3 < 0x400) {
    uVar2 = 0;
  }
  *(uint *)((long)&(ctx->base).pc_first + 4) = uVar2;
  *(undefined4 *)&(ctx->base).pc_first = 0;
  return;
}

Assistant:

static inline uint32_t extract32(uint32_t value, int start, int length)
{
    assert(start >= 0 && length > 0 && length <= 32 - start);
    return (value >> start) & (~0U >> (32 - length));
}